

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QRect __thiscall
QMainWindowLayout::dockWidgetAreaRect
          (QMainWindowLayout *this,DockWidgetArea area,DockWidgetAreaSize size)

{
  DockPosition dockPos;
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QDebug this_00;
  uint uVar5;
  QLoggingCategory *pQVar6;
  long lVar7;
  QArrayDataPointer<QDockAreaLayoutItem> *this_01;
  long in_FS_OFFSET;
  QRect QVar8;
  QByteArrayView QVar9;
  QDebug local_278;
  QDebug local_270;
  QDebug local_268;
  QDebug local_260 [3];
  undefined1 local_248 [24];
  char *pcStack_230;
  QLayoutItem *local_228;
  QMainWindow *pQStack_220;
  QRect local_218;
  undefined8 local_208 [5];
  undefined8 auStack_1e0 [45];
  QArrayDataPointer<QDockAreaLayoutItem> local_78 [2];
  int local_48;
  QMainWindowLayout local_44;
  QArrayData *local_40;
  QWidget **local_38;
  qsizetype local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = area - LeftDockWidgetArea;
  if ((uVar5 < 8) && ((0x8bU >> (uVar5 & 0x1f) & 1) != 0)) {
    dockPos = *(DockPosition *)(&DAT_006d9c90 + (ulong)uVar5 * 4);
    memset(local_208,0xaa,0x1e0);
    pcStack_230 = *(char **)(this + 0x1b8);
    local_228 = *(QLayoutItem **)(this + 0x1c0);
    pQStack_220 = *(QMainWindow **)(this + 0x1c8);
    local_218._0_8_ = *(undefined8 *)(this + 0x1d0);
    local_218._8_8_ = *(undefined8 *)(this + 0x1d8);
    local_248._0_4_ = (undefined4)*(undefined8 *)(this + 0x1a0);
    local_248._4_4_ = (undefined4)((ulong)*(undefined8 *)(this + 0x1a0) >> 0x20);
    local_248._8_4_ = (undefined4)*(undefined8 *)(this + 0x1a8);
    local_248._12_4_ = (undefined4)((ulong)*(undefined8 *)(this + 0x1a8) >> 0x20);
    local_248._16_4_ = (undefined4)*(undefined8 *)(this + 0x1b0);
    local_248._20_4_ = (undefined4)((ulong)*(undefined8 *)(this + 0x1b0) >> 0x20);
    lVar7 = 0x40;
    do {
      *(undefined8 *)(local_248 + lVar7) = *(undefined8 *)(this + lVar7 + 0x1a0);
      piVar1 = *(int **)(this + lVar7 + 0x1a8);
      *(int **)(local_248 + lVar7 + 8) = piVar1;
      *(undefined8 *)(local_248 + lVar7 + 0x10) = *(undefined8 *)(this + lVar7 + 0x1b0);
      *(undefined8 *)((long)&pcStack_230 + lVar7) = *(undefined8 *)(this + lVar7 + 0x1b8);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      uVar2 = *(undefined8 *)(this + lVar7 + 0x1c0);
      uVar3 = *(undefined8 *)(this + lVar7 + 0x1c0 + 8);
      uVar4 = *(undefined8 *)(this + lVar7 + 0x1d0 + 8);
      *(undefined8 *)((long)&local_218.x1.m_i + lVar7) = *(undefined8 *)(this + lVar7 + 0x1d0);
      *(undefined8 *)((long)local_208 + lVar7 + -8) = uVar4;
      *(undefined8 *)((long)&local_228 + lVar7) = uVar2;
      *(undefined8 *)((long)&pQStack_220 + lVar7) = uVar3;
      piVar1 = *(int **)(this + lVar7 + 0x1e0);
      *(int **)((long)local_208 + lVar7) = piVar1;
      *(undefined8 *)((long)local_208 + lVar7 + 8) = *(undefined8 *)(this + lVar7 + 0x1e8);
      *(undefined8 *)((long)local_208 + lVar7 + 0x10) = *(undefined8 *)(this + lVar7 + 0x1f0);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      *(undefined4 *)((long)auStack_1e0 + lVar7) = *(undefined4 *)(this + lVar7 + 0x208);
      uVar2 = *(undefined8 *)(this + lVar7 + 0x1f8 + 8);
      *(undefined8 *)((long)local_208 + lVar7 + 0x18) = *(undefined8 *)(this + lVar7 + 0x1f8);
      *(undefined8 *)((long)local_208 + lVar7 + 0x20) = uVar2;
      lVar7 = lVar7 + 0x70;
    } while (lVar7 != 0x200);
    local_44 = this[0x3a4];
    local_48 = *(int *)(this + 0x3a0);
    local_40 = *(QArrayData **)(this + 0x3a8);
    local_38 = *(QWidget ***)(this + 0x3b0);
    local_30 = *(qsizetype *)(this + 0x3b8);
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (size == Maximum) {
      QVar8 = QDockAreaLayout::gapRect((QDockAreaLayout *)local_248,dockPos);
    }
    else {
      QVar8._8_8_ = auStack_1e0[(ulong)dockPos * 0xe + 1];
      QVar8._0_8_ = auStack_1e0[(ulong)dockPos * 0xe];
    }
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,8,0x10);
      }
    }
    lVar7 = -0x1c0;
    this_01 = local_78;
    do {
      QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(this_01);
      piVar1 = (int *)this_01[-3].size;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)this_01[-3].size,8,0x10);
        }
      }
      this_01 = (QArrayDataPointer<QDockAreaLayoutItem> *)&this_01[-5].ptr;
      lVar7 = lVar7 + 0x70;
    } while (lVar7 != 0);
  }
  else {
    pQVar6 = QtPrivateLogging::lcQpaDockWidgets();
    if (((pQVar6->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      pcStack_230 = pQVar6->name;
      local_248._0_4_ = RightDockWidgetArea;
      local_248._4_4_ = NoDockWidgetArea;
      local_248._8_4_ = NoDockWidgetArea;
      local_248._12_4_ = NoDockWidgetArea;
      local_248._16_4_ = 0;
      local_248._20_4_ = 0;
      QMessageLogger::debug();
      this_00.stream = local_278.stream;
      QVar9.m_data = (storage_type *)0x31;
      QVar9.m_size = (qsizetype)local_260;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_260);
      if ((QArrayData *)local_260[0].stream != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_260[0].stream = *(int *)local_260[0].stream + -1;
        UNLOCK();
        if (*(int *)local_260[0].stream == 0) {
          QArrayData::deallocate((QArrayData *)local_260[0].stream,2,0x10);
        }
      }
      if (*(QTextStream *)(local_278.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_278.stream,' ');
      }
      *(int *)((QTextStream *)local_278.stream + 0x28) =
           *(int *)((QTextStream *)local_278.stream + 0x28) + 2;
      qt_QMetaEnum_flagDebugOperator
                (&local_268,(ulonglong)local_260,(QMetaObject *)(ulong)area,
                 (char *)&Qt::staticMetaObject);
      QDebug::~QDebug(local_260);
      QDebug::~QDebug(&local_268);
      QDebug::~QDebug(&local_270);
      QDebug::~QDebug(&local_278);
    }
    QVar8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMainWindowLayout::dockWidgetAreaRect(const Qt::DockWidgetArea area, DockWidgetAreaSize size) const
{
    const QInternal::DockPosition dockPosition = toDockPos(area);

    // Called with invalid dock widget area
    if (dockPosition == QInternal::DockCount) {
        qCDebug(lcQpaDockWidgets) << "QMainWindowLayout::dockWidgetAreaRect called with" << area;
        return QRect();
    }

    const QDockAreaLayout dl = layoutState.dockAreaLayout;

    // Return maximum or visible rectangle
    return (size == Maximum) ? dl.gapRect(dockPosition) : dl.docks[dockPosition].rect;
}